

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.cpp
# Opt level: O0

AddressType __thiscall
cfd::core::DescriptorScriptReference::GetAddressType(DescriptorScriptReference *this)

{
  bool bVar1;
  CfdException *pCVar2;
  allocator local_a1;
  string local_a0;
  CfdSourceLocation local_80;
  undefined1 local_65;
  allocator local_51;
  string local_50;
  CfdSourceLocation local_30;
  DescriptorScriptReference *local_18;
  DescriptorScriptReference *this_local;
  
  local_18 = this;
  if (this->script_type_ == kDescriptorScriptAddr) {
    this_local._4_4_ = core::Address::GetAddressType(&this->address_script_);
  }
  else if (this->script_type_ == kDescriptorScriptRaw) {
    bVar1 = Script::IsP2wpkhScript(&this->locking_script_);
    if (bVar1) {
      this_local._4_4_ = kP2wpkhAddress;
    }
    else {
      bVar1 = Script::IsP2wshScript(&this->locking_script_);
      if (bVar1) {
        this_local._4_4_ = kP2wshAddress;
      }
      else {
        bVar1 = Script::IsTaprootScript(&this->locking_script_);
        if (bVar1) {
          this_local._4_4_ = kTaprootAddress;
        }
        else {
          bVar1 = Script::IsP2shScript(&this->locking_script_);
          if (bVar1) {
            this_local._4_4_ = kP2shAddress;
          }
          else {
            bVar1 = Script::IsP2pkhScript(&this->locking_script_);
            if (!bVar1) {
              local_30.filename =
                   strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_descriptor.cpp"
                           ,0x2f);
              local_30.filename = local_30.filename + 1;
              local_30.line = 699;
              local_30.funcname = "GetAddressType";
              logger::warn<>(&local_30,
                             "Failed to GenerateAddress. raw type descriptor is not support.");
              local_65 = 1;
              pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string
                        ((string *)&local_50,"raw type descriptor is not support.",&local_51);
              CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,&local_50);
              local_65 = 0;
              __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
            }
            this_local._4_4_ = kP2pkhAddress;
          }
        }
      }
    }
  }
  else {
    bVar1 = Script::IsP2shScript(&this->locking_script_);
    if (bVar1) {
      bVar1 = Script::IsP2wpkhScript(&this->redeem_script_);
      if (bVar1) {
        this_local._4_4_ = kP2shP2wpkhAddress;
      }
      else {
        bVar1 = Script::IsP2wshScript(&this->redeem_script_);
        if (bVar1) {
          this_local._4_4_ = kP2shP2wshAddress;
        }
        else {
          this_local._4_4_ = kP2shAddress;
        }
      }
    }
    else {
      bVar1 = Script::IsP2wpkhScript(&this->locking_script_);
      if (bVar1) {
        this_local._4_4_ = kP2wpkhAddress;
      }
      else {
        bVar1 = Script::IsP2wshScript(&this->locking_script_);
        if (bVar1) {
          this_local._4_4_ = kP2wshAddress;
        }
        else {
          bVar1 = Script::IsTaprootScript(&this->locking_script_);
          if (bVar1) {
            this_local._4_4_ = kTaprootAddress;
          }
          else {
            bVar1 = Script::IsP2pkhScript(&this->locking_script_);
            if (bVar1) {
              this_local._4_4_ = kP2pkhAddress;
            }
            else {
              bVar1 = Script::IsP2pkScript(&this->locking_script_);
              if (!bVar1) {
                bVar1 = Script::IsMultisigScript(&this->locking_script_);
                if (!bVar1) {
                  local_80.filename =
                       strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_descriptor.cpp"
                               ,0x2f);
                  local_80.filename = local_80.filename + 1;
                  local_80.line = 0x2dc;
                  local_80.funcname = "GetAddressType";
                  logger::warn<>(&local_80,"Failed to GetAddressType. unknown address type.");
                  pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
                  ::std::allocator<char>::allocator();
                  ::std::__cxx11::string::string
                            ((string *)&local_a0,"unknown address type.",&local_a1);
                  CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,&local_a0);
                  __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
                }
              }
              this_local._4_4_ = kP2shAddress;
            }
          }
        }
      }
    }
  }
  return this_local._4_4_;
}

Assistant:

AddressType DescriptorScriptReference::GetAddressType() const {
  switch (script_type_) {
    case DescriptorScriptType::kDescriptorScriptRaw:
      if (locking_script_.IsP2wpkhScript()) {
        return AddressType::kP2wpkhAddress;
      } else if (locking_script_.IsP2wshScript()) {
        return AddressType::kP2wshAddress;
      } else if (locking_script_.IsTaprootScript()) {
        return AddressType::kTaprootAddress;
      } else if (locking_script_.IsP2shScript()) {
        return AddressType::kP2shAddress;
      } else if (locking_script_.IsP2pkhScript()) {
        return AddressType::kP2pkhAddress;
      }
      warn(
          CFD_LOG_SOURCE,
          "Failed to GenerateAddress. raw type descriptor is not support.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "raw type descriptor is not support.");
    case DescriptorScriptType::kDescriptorScriptAddr:
      return address_script_.GetAddressType();
    default:
      break;
  }
  if (locking_script_.IsP2shScript()) {
    if (redeem_script_.IsP2wpkhScript()) {
      return AddressType::kP2shP2wpkhAddress;
    } else if (redeem_script_.IsP2wshScript()) {
      return AddressType::kP2shP2wshAddress;
    }
    return AddressType::kP2shAddress;
  }
  if (locking_script_.IsP2wpkhScript()) {
    return AddressType::kP2wpkhAddress;
  }
  if (locking_script_.IsP2wshScript()) {
    return AddressType::kP2wshAddress;
  }
  if (locking_script_.IsTaprootScript()) {
    return AddressType::kTaprootAddress;
  }
  if (locking_script_.IsP2pkhScript()) {
    return AddressType::kP2pkhAddress;
  }
  if (locking_script_.IsP2pkScript() || locking_script_.IsMultisigScript()) {
    return AddressType::kP2shAddress;  // unsupported script
  }
  warn(CFD_LOG_SOURCE, "Failed to GetAddressType. unknown address type.");
  throw CfdException(
      CfdError::kCfdIllegalArgumentError, "unknown address type.");
}